

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

OptimizationMode
Imf_2_5::anon_unknown_6::detectOptimizationMode
          (vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
           *optData)

{
  char *pcVar1;
  size_t sVar2;
  OptimizationMode OVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
  *in_RDI;
  sliceOptimizationData *data;
  size_t i;
  size_t bankSize;
  OptimizationMode w;
  ulong local_38;
  ulong local_20;
  OptimizationMode local_8;
  
  OptimizationMode::OptimizationMode(&local_8);
  sVar4 = std::
          vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
          ::size(in_RDI);
  switch(sVar4) {
  case 3:
    break;
  case 4:
    break;
  default:
    goto LAB_007d4e20;
  case 6:
    break;
  case 8:
  }
  sVar4 = std::
          vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
          ::size(in_RDI);
  if (sVar4 < 5) {
    local_38 = std::
               vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
               ::size(in_RDI);
  }
  else {
    sVar4 = std::
            vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
            ::size(in_RDI);
    local_38 = sVar4 >> 1;
  }
  for (local_20 = 0;
      sVar4 = std::
              vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
              ::size(in_RDI), local_20 < sVar4; local_20 = local_20 + 1) {
    pvVar5 = std::
             vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
             ::operator[](in_RDI,local_20);
    if ((((((pvVar5->fill & 1U) != 0) && (local_20 != 3)) && (local_20 != 7)) ||
        (pvVar5->xStride != local_38 * 2)) ||
       ((((local_20 != 0 && (local_20 != local_38)) &&
         (pcVar1 = pvVar5->base,
         pvVar6 = std::
                  vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                  ::operator[](in_RDI,local_20 - 1), pcVar1 != pvVar6->base + 2)) ||
        ((local_20 != 0 &&
         (sVar2 = pvVar5->yStride,
         pvVar5 = std::
                  vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                  ::operator[](in_RDI,local_20 - 1), sVar2 != pvVar5->yStride))))))
    goto LAB_007d4e20;
  }
  pvVar5 = std::
           vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
           ::operator[](in_RDI,0);
  local_8._ySampling = pvVar5->ySampling;
  local_8._optimizable = true;
LAB_007d4e20:
  OVar3._ySampling = local_8._ySampling;
  OVar3._optimizable = local_8._optimizable;
  OVar3._1_3_ = local_8._1_3_;
  return OVar3;
}

Assistant:

OptimizationMode
detectOptimizationMode (const vector<sliceOptimizationData>& optData)
{
    OptimizationMode w;
    
    // need to be compiled with SSE optimisations: if not, just returns false
#ifdef IMF_HAVE_SSE2
    
    
    // only handle reading 3,4,6 or 8 channels
    switch(optData.size())
    {
        case 3 : break;
        case 4 : break;
        case 6 : break;
        case 8 : break;
        default :
            return w;
    }
    
    //
    // the point at which data switches between the primary and secondary bank
    //
    size_t bankSize = optData.size()>4 ? optData.size()/2 : optData.size();
    
    for(size_t i=0;i<optData.size();i++)
    {
        const sliceOptimizationData& data = optData[i];
        // can't fill anything other than channel 3 or channel 7
        if(data.fill)
        {
            if(i!=3 && i!=7)
            {
                return w;
            }
        }
        
        // cannot have gaps in the channel layout, so the stride must be (number of channels written in the bank)*2
        if(data.xStride !=bankSize*2)
        {
            return w;
        }
        
        // each bank of channels must be channel interleaved: each channel base pointer must be (previous channel+2)
        // this also means channel sampling pattern must be consistent, as must yStride
        if(i!=0 && i!=bankSize)
        {
            if(data.base!=optData[i-1].base+2)
            {
                return w;
            }
        }
        if(i!=0)
        {
            
            if(data.yStride!=optData[i-1].yStride)
            {
                return w;
            }
        }
    }
    

    w._ySampling=optData[0].ySampling;
    w._optimizable=true;
    
#endif

    return w;
}